

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O0

Status * __thiscall
draco::PlyDecoder::DecodeFromBuffer
          (PlyDecoder *this,DecoderBuffer *buffer,PointCloud *out_point_cloud)

{
  DecoderBuffer *this_00;
  undefined8 in_RCX;
  DecoderBuffer *in_RDX;
  long in_RSI;
  Status *in_RDI;
  PlyDecoder *in_stack_00000108;
  char *in_stack_ffffffffffffffb8;
  
  *(undefined8 *)(in_RSI + 0x40) = in_RCX;
  this_00 = (DecoderBuffer *)DecoderBuffer::data_head(in_RDX);
  DecoderBuffer::remaining_size(in_RDX);
  DecoderBuffer::Init(this_00,in_stack_ffffffffffffffb8,0x129693);
  DecodeInternal(in_stack_00000108);
  return in_RDI;
}

Assistant:

Status PlyDecoder::DecodeFromBuffer(DecoderBuffer *buffer,
                                    PointCloud *out_point_cloud) {
  out_point_cloud_ = out_point_cloud;
  buffer_.Init(buffer->data_head(), buffer->remaining_size());
  return DecodeInternal();
}